

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testresult.cpp
# Opt level: O1

kRunResultAction __thiscall trun::TestResult::CheckIfContinue(TestResult *this)

{
  char cVar1;
  kRunResultAction kVar2;
  Config *pCVar3;
  
  if (this->testResult == kTestResult_AllFail) {
    pCVar3 = Config::Instance();
    kVar2 = kAbortAll;
    cVar1 = pCVar3->stopOnAllFail;
  }
  else {
    if (this->testResult != kTestResult_ModuleFail) {
      return kContinue;
    }
    pCVar3 = Config::Instance();
    kVar2 = kAbortModule;
    cVar1 = pCVar3->skipOnModuleFail;
  }
  if (cVar1 == '\0') {
    return kContinue;
  }
  return kVar2;
}

Assistant:

TestResult::kRunResultAction TestResult::CheckIfContinue() const {
    //auto pLogger = gnilk::Logger::GetLogger("TestResult");

    if (testResult == kTestResult_ModuleFail) {
        if (Config::Instance().skipOnModuleFail) {
            // pLogger->Info("Module test failure, skipping remaining test cases in library");
            return kRunResultAction::kAbortModule;
        } else {
            // pLogger->Info("Module test failure, continue anyway (configuration)");
        }
    } else if (testResult == kTestResult_AllFail) {
        if (Config::Instance().stopOnAllFail) {
            // pLogger->Critical("Total test failure, aborting");
            return kRunResultAction::kAbortAll;
        } else {
            // pLogger->Info("Total test failure, continue anyway (configuration)");
        }
    }
    return kRunResultAction::kContinue;

}